

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ZeroPageQueue::PushZeroPageEntry(ZeroPageQueue *this,FreePageEntry *entry)

{
  AutoCriticalSection local_28;
  AutoCriticalSection autoCS;
  
  local_28.cs = &(this->super_BackgroundPageQueue).backgroundPageQueueCriticalSection;
  CCLock::Enter(&(local_28.cs)->super_CCLock);
  entry->Next = this->pendingZeroPageList;
  this->pendingZeroPageList = entry;
  AutoCriticalSection::~AutoCriticalSection(&local_28);
  return;
}

Assistant:

void PushZeroPageEntry(FreePageEntry* entry)
        {
#if SUPPORT_WIN32_SLIST
            ::InterlockedPushEntrySList(&pendingZeroPageList, entry);
#else
            AutoCriticalSection autoCS(&this->backgroundPageQueueCriticalSection);
            entry->Next = pendingZeroPageList;
            pendingZeroPageList = entry;
#endif
        }